

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::FoundationPileWithTwoTest::FoundationPileWithTwoTest
          (FoundationPileWithTwoTest *this)

{
  reference __t;
  element_type *peVar1;
  undefined1 local_30 [8];
  optional<solitaire::cards::Card> cardToAdd;
  Card local_18;
  FoundationPileWithTwoTest *local_10;
  FoundationPileWithTwoTest *this_local;
  
  local_10 = this;
  FoundationPileWithAceTest::FoundationPileWithAceTest(&this->super_FoundationPileWithAceTest);
  (this->super_FoundationPileWithAceTest).super_EmptyFoundationPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__FoundationPileWithTwoTest_00509fd8;
  solitaire::cards::Card::Card(&local_18,Two,Heart);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::push_back
            (&(this->super_FoundationPileWithAceTest).pileCards,&local_18);
  __t = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::back
                  (&(this->super_FoundationPileWithAceTest).pileCards);
  std::optional<solitaire::cards::Card>::optional<solitaire::cards::Card_&,_true>
            ((optional<solitaire::cards::Card> *)local_30,__t);
  peVar1 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_FoundationPileWithAceTest).super_EmptyFoundationPileTest.
                            pile);
  (*(peVar1->super_FoundationPile).super_Archiver._vptr_Archiver[4])
            (peVar1,(optional<solitaire::cards::Card> *)local_30);
  return;
}

Assistant:

FoundationPileWithTwoTest() {
        pileCards.push_back(Card {Value::Two, Suit::Heart});

        std::optional<Card> cardToAdd = pileCards.back();
        pile->tryAddCard(cardToAdd);
    }